

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::GroupedAggregateHashTable::Combine
          (GroupedAggregateHashTable *this,GroupedAggregateHashTable *other)

{
  pointer psVar1;
  type other_data;
  pointer *__ptr;
  shared_ptr<duckdb::ArenaAllocator,_true> *stored_allocator;
  pointer __args;
  undefined1 local_28 [8];
  _func_int **local_20;
  
  AcquirePartitionedData((GroupedAggregateHashTable *)&stack0xffffffffffffffe0);
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  ::operator->((unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                *)&stack0xffffffffffffffe0);
  PartitionedTupleData::GetUnpartitioned((PartitionedTupleData *)local_28);
  other_data = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
               ::operator*((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                            *)local_28);
  Combine(this,other_data,(optional_ptr<std::atomic<double>,_true>)0x0);
  ::std::
  vector<duckdb::shared_ptr<duckdb::ArenaAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::ArenaAllocator,true>&>
            ((vector<duckdb::shared_ptr<duckdb::ArenaAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,true>>>
              *)&this->stored_allocators,&other->aggregate_allocator);
  psVar1 = (other->stored_allocators).
           super_vector<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (other->stored_allocators).
                super_vector<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
                .
                super__Vector_base<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; __args != psVar1; __args = __args + 1) {
    ::std::
    vector<duckdb::shared_ptr<duckdb::ArenaAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::ArenaAllocator,true>const&>
              ((vector<duckdb::shared_ptr<duckdb::ArenaAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,true>>>
                *)&this->stored_allocators,__args);
  }
  if ((tuple<duckdb::TupleDataCollection_*,_std::default_delete<duckdb::TupleDataCollection>_>)
      local_28 != (_Head_base<0UL,_duckdb::TupleDataCollection_*,_false>)0x0) {
    TupleDataCollection::~TupleDataCollection((TupleDataCollection *)local_28);
    operator_delete((void *)local_28);
  }
  if (local_20 != (_func_int **)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  return;
}

Assistant:

void GroupedAggregateHashTable::Combine(GroupedAggregateHashTable &other) {
	auto other_partitioned_data = other.AcquirePartitionedData();
	auto other_data = other_partitioned_data->GetUnpartitioned();
	Combine(*other_data);

	// Inherit ownership to all stored aggregate allocators
	stored_allocators.emplace_back(other.aggregate_allocator);
	for (const auto &stored_allocator : other.stored_allocators) {
		stored_allocators.emplace_back(stored_allocator);
	}
}